

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O0

int __thiscall QualEngine::close(QualEngine *this,int __fd)

{
  QualEngine *this_local;
  
  if (this->qualSolver != (QualSolver *)0x0) {
    (*this->qualSolver->_vptr_QualSolver[1])();
  }
  this->qualSolver = (QualSolver *)0x0;
  std::vector<int,_std::allocator<int>_>::clear(&this->sortedLinks);
  std::vector<char,_std::allocator<char>_>::clear(&this->flowDirection);
  this->engineState = CLOSED;
  return (int)this;
}

Assistant:

void QualEngine::close()
{
    delete qualSolver;
    qualSolver = nullptr;
    sortedLinks.clear();
    flowDirection.clear();
    engineState = QualEngine::CLOSED;
}